

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
nlohmann::json_abi_v3_11_3::detail::
concat<std::__cxx11::string,char_const*,char_const(&)[15],std::__cxx11::string,char>
          (char **args,char (*args_1) [15],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,char *args_3)

{
  char **arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_1;
  char (*in_stack_ffffffffffffffb8) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  
  uVar1 = 0;
  rest_1 = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0);
  arg = (char **)concat_length<char[15],std::__cxx11::string,char>
                           ((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,rest_1,
                            (char *)in_RDI);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_stack_ffffffffffffffc0,arg,(char (*) [15])rest_1,in_RDI,(char *)0x5a9ed3);
  return rest_1;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}